

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Vertex(AMFImporter *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  CAMFImporter_NodeElement *this_00;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_49;
  string local_48;
  byte local_27;
  byte local_26;
  byte local_25;
  bool close_found;
  bool coord_read;
  bool col_read;
  CAMFImporter_NodeElement *local_18;
  CAMFImporter_NodeElement *ne;
  AMFImporter *this_local;
  
  ne = (CAMFImporter_NodeElement *)this;
  this_00 = (CAMFImporter_NodeElement *)operator_new(0x50);
  CAMFImporter_NodeElement_Vertex::CAMFImporter_NodeElement_Vertex
            ((CAMFImporter_NodeElement_Vertex *)this_00,this->mNodeElement_Cur);
  local_18 = this_00;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    local_25 = 0;
    local_26 = 0;
    ParseHelper_Node_Enter(this,local_18);
    local_27 = 0;
    do {
      do {
        while( true ) {
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar2 & 1) == 0) goto LAB_0057b168;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_48,"color",&local_49);
          bVar1 = XML_CheckNode_NameEqual(this,&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          std::allocator<char>::~allocator((allocator<char> *)&local_49);
          if (bVar1) {
            if ((local_25 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_70,"color",&local_71);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_98,"Only one color can be defined for <vertex>.",&local_99
                        );
              Throw_MoreThanOnceDefined(this,&local_70,&local_98);
              std::__cxx11::string::~string((string *)&local_98);
              std::allocator<char>::~allocator((allocator<char> *)&local_99);
              std::__cxx11::string::~string((string *)&local_70);
              std::allocator<char>::~allocator((allocator<char> *)&local_71);
            }
            ParseNode_Color(this);
            local_25 = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_c0,"coordinates",&local_c1);
            bVar1 = XML_CheckNode_NameEqual(this,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_c1);
            if (bVar1) {
              if ((local_26 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_e8,"coordinates",&local_e9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_110,
                           "Only one coordinates set can be defined for <vertex>.",&local_111);
                Throw_MoreThanOnceDefined(this,&local_e8,&local_110);
                std::__cxx11::string::~string((string *)&local_110);
                std::allocator<char>::~allocator((allocator<char> *)&local_111);
                std::__cxx11::string::~string((string *)&local_e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_e9);
              }
              ParseNode_Coordinates(this);
              local_26 = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_138,"metadata",&local_139);
              bVar1 = XML_CheckNode_NameEqual(this,&local_138);
              std::__cxx11::string::~string((string *)&local_138);
              std::allocator<char>::~allocator((allocator<char> *)&local_139);
              if (bVar1) {
                ParseNode_Metadata(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_160,"vertex",&local_161);
                XML_CheckNode_SkipUnsupported(this,&local_160);
                std::__cxx11::string::~string((string *)&local_160);
                std::allocator<char>::~allocator((allocator<char> *)&local_161);
              }
            }
          }
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar3 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188,"vertex",&local_189);
      bVar1 = XML_CheckNode_NameEqual(this,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
    } while (!bVar1);
    local_27 = 1;
LAB_0057b168:
    if ((local_27 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,"vertex",&local_1b1);
      Throw_CloseNotFound(this,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    }
    ParseHelper_Node_Exit(this);
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,&local_18);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,&local_18);
  return;
}

Assistant:

void AMFImporter::ParseNode_Vertex()
{
CAMFImporter_NodeElement* ne;

	// create new mesh object.
	ne = new CAMFImporter_NodeElement_Vertex(mNodeElement_Cur);
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false;
		bool coord_read = false;

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("vertex");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if data already defined.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <vertex>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("coordinates"))
			{
				// Check if data already defined.
				if(coord_read) Throw_MoreThanOnceDefined("coordinates", "Only one coordinates set can be defined for <vertex>.");
				// read data and set flag about it
				ParseNode_Coordinates();
				coord_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("vertex");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}